

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

float ncnn::reduction<ncnn::reduction_op_sumexp>(float v0,float *ptr,int size,int stride)

{
  int in_EDX;
  int in_ESI;
  reduction_op_sumexp *in_RDI;
  float in_XMM0_Da;
  int i;
  float sum;
  reduction_op_sumexp op;
  int local_24;
  undefined4 in_stack_ffffffffffffffe4;
  
  for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
    in_XMM0_Da = reduction_op_sumexp::operator()
                           (in_RDI,(float *)CONCAT44(in_ESI,in_EDX),
                            (float *)CONCAT44(in_stack_ffffffffffffffe4,in_XMM0_Da));
    in_RDI = in_RDI + (long)in_EDX * 4;
  }
  return in_XMM0_Da;
}

Assistant:

static float reduction(float v0, const float* ptr, int size, int stride)
{
    Op op;

    float sum = v0;
    for (int i = 0; i < size; i++)
    {
        sum = op(sum, *ptr);
        ptr += stride;
    }

    return sum;
}